

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O1

void __thiscall
LinkedObjectFile::pointer_link_split_word
          (LinkedObjectFile *this,int source_segment,int source_hi_offset,int source_lo_offset,
          int dest_segment,int dest_offset)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  
  if ((source_hi_offset & 3U) != 0) {
    __assert_fail("(source_hi_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0xa3,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
  }
  if ((source_lo_offset & 3U) != 0) {
    __assert_fail("(source_lo_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0xa4,"void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
  }
  uVar6 = (ulong)source_segment;
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
    uVar7 = (ulong)(source_hi_offset >> 2);
    lVar2 = *(long *)&pvVar1[uVar6].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data;
    uVar4 = ((long)*(pointer *)
                    ((long)&pvVar1[uVar6].
                            super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar2 >> 4) * -0x5555555555555555;
    uVar6 = uVar7;
    if ((uVar7 <= uVar4 && uVar4 - uVar7 != 0) &&
       (uVar6 = (ulong)(source_lo_offset >> 2), uVar6 <= uVar4 && uVar4 - uVar6 != 0)) {
      piVar8 = (int *)(uVar7 * 0x30 + lVar2);
      if (*piVar8 != 0) {
        __assert_fail("hi_word.kind == LinkedWord::PLAIN_DATA",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0xaa,
                      "void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
      }
      piVar5 = (int *)(lVar2 + uVar6 * 0x30);
      if (*piVar5 != 0) {
        __assert_fail("lo_word.kind == LinkedWord::PLAIN_DATA",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                      ,0xab,
                      "void LinkedObjectFile::pointer_link_split_word(int, int, int, int, int)");
      }
      *piVar8 = 2;
      iVar3 = get_label_id_for(this,dest_segment,dest_offset);
      piVar8[2] = iVar3;
      *piVar5 = 3;
      piVar5[2] = iVar3;
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
}

Assistant:

void LinkedObjectFile::pointer_link_split_word(int source_segment,
                                               int source_hi_offset,
                                               int source_lo_offset,
                                               int dest_segment,
                                               int dest_offset) {
  assert((source_hi_offset % 4) == 0);
  assert((source_lo_offset % 4) == 0);

  auto& hi_word = words_by_seg.at(source_segment).at(source_hi_offset / 4);
  auto& lo_word = words_by_seg.at(source_segment).at(source_lo_offset / 4);

  //  assert(dest_offset / 4 <= (int)words_by_seg.at(dest_segment).size());
  assert(hi_word.kind == LinkedWord::PLAIN_DATA);
  assert(lo_word.kind == LinkedWord::PLAIN_DATA);

  hi_word.kind = LinkedWord::HI_PTR;
  hi_word.label_id = get_label_id_for(dest_segment, dest_offset);

  lo_word.kind = LinkedWord::LO_PTR;
  lo_word.label_id = hi_word.label_id;
}